

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedigrees.c
# Opt level: O0

void load_pedigree_leaf_into_user_worker(__cilkrts_worker *w)

{
  __cilkrts_pedigree *pedigree_leaf_00;
  long in_RDI;
  __cilkrts_pedigree *pedigree_leaf;
  int in_stack_ffffffffffffffec;
  
  if (*(int *)(*(long *)(in_RDI + 0x38) + 0x88) != 2) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/pedigrees.c"
                  ,0x4a,"w->l->type == WORKER_USER");
  }
  pedigree_leaf_00 = __cilkrts_get_tls_pedigree_leaf(in_stack_ffffffffffffffec);
  *(uint64_t *)(in_RDI + 0x60) = pedigree_leaf_00->rank;
  *(__cilkrts_pedigree **)(in_RDI + 0x68) = pedigree_leaf_00->parent;
  if (*(long *)(*(long *)(in_RDI + 0x38) + 0x108) != 0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/pedigrees.c"
                  ,0x50,"w->l->original_pedigree_leaf == NULL");
  }
  *(__cilkrts_pedigree **)(*(long *)(in_RDI + 0x38) + 0x108) = pedigree_leaf_00;
  __cilkrts_set_tls_pedigree_leaf(pedigree_leaf_00);
  if (*(long *)(in_RDI + 0x68) == 0) {
    __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/pedigrees.c"
                  ,0x56,"w->pedigree.parent");
  }
  if (*(long *)(*(long *)(in_RDI + 0x68) + 8) == 0) {
    return;
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/pedigrees.c"
                ,0x57,"w->pedigree.parent->parent == NULL");
}

Assistant:

void load_pedigree_leaf_into_user_worker(__cilkrts_worker *w)
{
    __cilkrts_pedigree *pedigree_leaf;
    CILK_ASSERT(w->l->type == WORKER_USER);
    pedigree_leaf = __cilkrts_get_tls_pedigree_leaf(1);
    w->pedigree = *pedigree_leaf;

    // Save a pointer to the old leaf.
    // We'll need to restore it later.
    CILK_ASSERT(w->l->original_pedigree_leaf == NULL);
    w->l->original_pedigree_leaf = pedigree_leaf;
    
    __cilkrts_set_tls_pedigree_leaf(&w->pedigree);
    
    // Check that this new pedigree root has at least two values.
    CILK_ASSERT(w->pedigree.parent);
    CILK_ASSERT(w->pedigree.parent->parent == NULL);
}